

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global_object.cpp
# Opt level: O2

void __thiscall mjs::global_object_impl::fixup(global_object_impl *this)

{
  gc_heap *this_00;
  long lVar1;
  
  this_00 = (this->super_global_object).super_object.heap_;
  if ((this->string_cache_).entries_.pos_ != 0) {
    gc_heap::register_fixup(this_00,(uint32_t *)&this->string_cache_);
  }
  gc_heap_ptr_untracked<mjs::object,_true>::fixup(&this->object_prototype_,this_00);
  gc_heap_ptr_untracked<mjs::object,_true>::fixup(&this->function_prototype_,this_00);
  gc_heap_ptr_untracked<mjs::object,_true>::fixup(&this->array_prototype_,this_00);
  gc_heap_ptr_untracked<mjs::object,_true>::fixup(&this->string_prototype_,this_00);
  gc_heap_ptr_untracked<mjs::object,_true>::fixup(&this->boolean_prototype_,this_00);
  gc_heap_ptr_untracked<mjs::object,_true>::fixup(&this->number_prototype_,this_00);
  gc_heap_ptr_untracked<mjs::object,_true>::fixup(&this->regexp_prototype_,this_00);
  for (lVar1 = 0x90; lVar1 != 0xb0; lVar1 = lVar1 + 4) {
    gc_heap_ptr_untracked<mjs::object,_true>::fixup
              ((gc_heap_ptr_untracked<mjs::object,_true> *)
               ((long)&(this->super_global_object).super_object._vptr_object + lVar1),this_00);
  }
  gc_heap_ptr_untracked<mjs::object,_true>::fixup(&this->thrower_,this_00);
  object::fixup((object *)this);
  return;
}

Assistant:

void fixup() {
        auto& h = heap();
        string_cache_.fixup(h);
        object_prototype_.fixup(h);
        function_prototype_.fixup(h);
        array_prototype_.fixup(h);
        string_prototype_.fixup(h);
        boolean_prototype_.fixup(h);
        number_prototype_.fixup(h);
        regexp_prototype_.fixup(h);
        for (auto& e: error_prototype_) {
            e.fixup(h);
        }
        thrower_.fixup(h);
        global_object::fixup();
    }